

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkMate.cpp
# Opt level: O2

void __thiscall
chrono::ChLinkMateXdistance::ArchiveIN(ChLinkMateXdistance *this,ChArchiveIn *marchive)

{
  ChNameValue<double> local_28;
  
  ChArchiveIn::VersionRead<chrono::ChLinkMateXdistance>(marchive);
  ChLinkMateGeneric::ArchiveIN(&this->super_ChLinkMateGeneric,marchive);
  local_28._value = &this->distance;
  local_28._name = "distance";
  local_28._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_28);
  return;
}

Assistant:

void ChLinkMateXdistance::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/ marchive.VersionRead<ChLinkMateXdistance>();

    // deserialize parent class
    ChLinkMateGeneric::ArchiveIN(marchive);

    // deserialize all member data:
    marchive >> CHNVP(distance);
}